

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O1

FT_Error FT_Stream_OpenGzip(FT_Stream stream,FT_Stream source)

{
  FT_Memory memory;
  FT_Error FVar1;
  int iVar2;
  FT_GZipFile zip;
  FT_ULong FVar3;
  code *pcVar4;
  code *extraout_RAX;
  code *count;
  bool bVar5;
  FT_Error error;
  FT_Error local_40;
  int local_3c;
  code *local_38;
  
  if (stream == (FT_Stream)0x0 || source == (FT_Stream)0x0) {
    return 0x28;
  }
  memory = source->memory;
  local_40 = ft_gzip_check_header(source);
  if (local_40 != 0) {
    return local_40;
  }
  stream->close = (FT_Stream_CloseFunc)0x0;
  stream->memory = (FT_Memory)0x0;
  stream->cursor = (uchar *)0x0;
  stream->limit = (uchar *)0x0;
  (stream->pathname).value = 0;
  stream->read = (FT_Stream_IoFunc)0x0;
  stream->pos = 0;
  (stream->descriptor).value = 0;
  stream->base = (uchar *)0x0;
  stream->size = 0;
  stream->memory = memory;
  zip = (FT_GZipFile)ft_mem_qalloc(memory,0x20a8,&local_40);
  if (local_40 == 0) {
    zip->stream = stream;
    zip->source = source;
    zip->memory = stream->memory;
    zip->limit = (FT_Byte *)&zip->pos;
    zip->cursor = (FT_Byte *)&zip->pos;
    zip->pos = 0;
    iVar2 = ft_gzip_check_header(source);
    if (iVar2 == 0) {
      FVar3 = FT_Stream_Pos(source);
      zip->start = FVar3;
      (zip->zstream).zalloc = ft_gzip_alloc;
      (zip->zstream).zfree = ft_gzip_free;
      (zip->zstream).opaque = source->memory;
      (zip->zstream).avail_in = 0;
      (zip->zstream).next_in = zip->buffer;
      iVar2 = inflateInit2_(&zip->zstream,0xfffffff1,"1.2.11",0x70);
      if ((iVar2 != 0) || (iVar2 = 0, (zip->zstream).next_in == (Bytef *)0x0)) {
        iVar2 = 3;
      }
    }
    if (iVar2 != 0) {
      local_40 = iVar2;
      ft_mem_free(memory,zip);
      return local_40;
    }
    (stream->descriptor).pointer = zip;
    local_40 = 0;
  }
  FVar3 = source->pos;
  FVar1 = FT_Stream_Seek(source,source->size - 4);
  if (FVar1 == 0) {
    pcVar4 = (code *)FT_Stream_ReadULongLE(source,&local_3c);
    count = (code *)0x0;
    if (local_3c == 0) {
      count = pcVar4;
    }
    FT_Stream_Seek(source,FVar3);
  }
  else {
    count = (code *)0x0;
  }
  if (count + -1 < (code *)0x9fff) {
    pcVar4 = (code *)ft_mem_alloc(memory,(FT_Long)count,&local_40);
    if (local_40 == 0) {
      local_38 = (code *)ft_gzip_file_io(zip,0,(FT_Byte *)pcVar4,(FT_ULong)count);
      bVar5 = local_38 != count;
      if (bVar5) {
        ft_gzip_file_io(zip,0,(FT_Byte *)0x0,0);
        ft_mem_free(memory,pcVar4);
        pcVar4 = extraout_RAX;
      }
      else {
        inflateEnd(&zip->zstream);
        (zip->zstream).next_out = (Bytef *)0x0;
        (zip->zstream).avail_out = 0;
        zip->source = (FT_Stream)0x0;
        zip->stream = (FT_Stream)0x0;
        zip->memory = (FT_Memory)0x0;
        (zip->zstream).next_in = (Bytef *)0x0;
        (zip->zstream).avail_in = 0;
        (zip->zstream).zalloc = (alloc_func)0x0;
        (zip->zstream).zfree = (free_func)0x0;
        (zip->zstream).opaque = (voidpf)0x0;
        ft_mem_free(memory,zip);
        stream->size = (unsigned_long)count;
        stream->pos = 0;
        (stream->descriptor).value = 0;
        stream->base = (uchar *)pcVar4;
        stream->read = (FT_Stream_IoFunc)0x0;
        pcVar4 = ft_gzip_stream_close;
        stream->close = ft_gzip_stream_close;
      }
      bVar5 = !bVar5;
      if (local_38 != count) goto LAB_0018702e;
    }
    else {
LAB_0018702e:
      local_40 = 0;
      bVar5 = false;
    }
    if (bVar5) goto LAB_0018704e;
  }
  pcVar4 = (code *)&DAT_7fffffff;
  if (count != (code *)0x0) {
    pcVar4 = count;
  }
  stream->size = (unsigned_long)pcVar4;
  bVar5 = false;
LAB_0018704e:
  FVar1 = local_40;
  if ((!bVar5) && (FVar1 = (FT_Error)pcVar4, !bVar5)) {
    stream->pos = 0;
    stream->base = (uchar *)0x0;
    stream->read = ft_gzip_stream_io;
    stream->close = ft_gzip_stream_close;
    FVar1 = local_40;
  }
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stream_OpenGzip( FT_Stream  stream,
                      FT_Stream  source )
  {
    FT_Error     error;
    FT_Memory    memory;
    FT_GZipFile  zip = NULL;


    if ( !stream || !source )
    {
      error = FT_THROW( Invalid_Stream_Handle );
      goto Exit;
    }

    memory = source->memory;

    /*
     *  check the header right now; this prevents allocating un-necessary
     *  objects when we don't need them
     */
    error = ft_gzip_check_header( source );
    if ( error )
      goto Exit;

    FT_ZERO( stream );
    stream->memory = memory;

    if ( !FT_QNEW( zip ) )
    {
      error = ft_gzip_file_init( zip, stream, source );
      if ( error )
      {
        FT_FREE( zip );
        goto Exit;
      }

      stream->descriptor.pointer = zip;
    }

    /*
     *  We use the following trick to try to dramatically improve the
     *  performance while dealing with small files.  If the original stream
     *  size is less than a certain threshold, we try to load the whole font
     *  file into memory.  This saves us from using the 32KB buffer needed
     *  to inflate the file, plus the two 4KB intermediate input/output
     *  buffers used in the `FT_GZipFile' structure.
     */
    {
      FT_ULong  zip_size = ft_gzip_get_uncompressed_size( source );


      if ( zip_size != 0 && zip_size < 40 * 1024 )
      {
        FT_Byte*  zip_buff = NULL;


        if ( !FT_ALLOC( zip_buff, zip_size ) )
        {
          FT_ULong  count;


          count = ft_gzip_file_io( zip, 0, zip_buff, zip_size );
          if ( count == zip_size )
          {
            ft_gzip_file_done( zip );
            FT_FREE( zip );

            stream->descriptor.pointer = NULL;

            stream->size  = zip_size;
            stream->pos   = 0;
            stream->base  = zip_buff;
            stream->read  = NULL;
            stream->close = ft_gzip_stream_close;

            goto Exit;
          }

          ft_gzip_file_io( zip, 0, NULL, 0 );
          FT_FREE( zip_buff );
        }
        error = FT_Err_Ok;
      }

      if ( zip_size )
        stream->size = zip_size;
      else
        stream->size  = 0x7FFFFFFFL;  /* don't know the real size! */
    }

    stream->pos   = 0;
    stream->base  = NULL;
    stream->read  = ft_gzip_stream_io;
    stream->close = ft_gzip_stream_close;

  Exit:
    return error;
  }